

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

void __thiscall ot::commissioner::JobManager::RunJobs(JobManager *this)

{
  pointer ppJVar1;
  pointer ppJVar2;
  
  ppJVar2 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppJVar1 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppJVar2 == ppJVar1) {
      WaitForJobs(this);
      return;
    }
    if (*ppJVar2 == (Job *)0x0) break;
    Job::Run(*ppJVar2);
    ppJVar2 = ppJVar2 + 1;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                ,0x277,"void ot::commissioner::JobManager::RunJobs()");
}

Assistant:

void JobManager::RunJobs()
{
    for (auto job : mJobPool)
    {
        ASSERT(job != nullptr);
        job->Run();
    }
    WaitForJobs();
}